

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O1

void absl::lts_20250127::log_internal::EncodeMessageLength(Span<char> msg,Span<char> *buf)

{
  Span<char> *in_RCX;
  pointer local_10;
  uint64_t local_8;
  
  local_8 = msg.len_;
  local_10 = msg.ptr_;
  if (local_10 != (pointer)0x0) {
    if (buf->ptr_ < local_10) {
      __assert_fail("buf->data() >= msg.data()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/log/internal/proto.cc"
                    ,0x90,
                    "void absl::log_internal::EncodeMessageLength(absl::Span<char>, const absl::Span<char> *)"
                   );
    }
    anon_unknown_4::EncodeRawVarint
              ((anon_unknown_4 *)(buf->ptr_ + -(long)(local_10 + local_8)),local_8,(size_t)&local_10
               ,in_RCX);
  }
  return;
}

Assistant:

void EncodeMessageLength(absl::Span<char> msg, const absl::Span<char> *buf) {
  if (!msg.data()) return;
  assert(buf->data() >= msg.data());
  if (buf->data() < msg.data()) return;
  EncodeRawVarint(
      static_cast<uint64_t>(buf->data() - (msg.data() + msg.size())),
      msg.size(), &msg);
}